

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

void gf256_addset_mem(void *vz,void *vx,void *vy,int bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong *puVar17;
  uint in_ECX;
  ulong *puVar18;
  ulong *puVar19;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  int offset;
  uint32_t *y4;
  uint32_t *x4;
  uint32_t *z4;
  int four;
  uint64_t *y8;
  uint64_t *x8;
  uint64_t *z8;
  int eight;
  uint8_t *y1;
  uint8_t *x1;
  uint8_t *z1;
  __m128i y3;
  __m128i y2;
  __m128i y1_1;
  __m128i y0;
  __m128i x3;
  __m128i x2;
  __m128i x1_1;
  __m128i x0;
  uint i;
  uint count;
  __m256i *y32;
  __m256i *x32;
  __m256i *z32;
  __m128i *y16;
  __m128i *x16;
  __m128i *z16;
  uint local_2a8;
  ulong *local_288;
  ulong *local_280;
  ulong *local_278;
  uint local_26c;
  
  local_288 = in_RDX;
  local_280 = in_RSI;
  local_278 = in_RDI;
  local_26c = in_ECX;
  if (CpuHasAVX2) {
    uVar15 = (int)in_ECX / 0x20;
    for (local_2a8 = 0; local_2a8 < uVar15; local_2a8 = local_2a8 + 1) {
      puVar17 = in_RDI + (ulong)local_2a8 * 4;
      puVar18 = in_RSI + (ulong)local_2a8 * 4;
      uVar1 = puVar18[1];
      uVar2 = puVar18[2];
      uVar3 = puVar18[3];
      puVar19 = in_RDX + (ulong)local_2a8 * 4;
      uVar4 = puVar19[1];
      uVar5 = puVar19[2];
      uVar6 = puVar19[3];
      *puVar17 = *puVar18 ^ *puVar19;
      puVar17[1] = uVar1 ^ uVar4;
      puVar17[2] = uVar2 ^ uVar5;
      puVar17[3] = uVar3 ^ uVar6;
    }
    local_26c = (int)in_ECX % 0x20;
    local_278 = in_RDI + (ulong)uVar15 * 4;
    local_280 = in_RSI + (ulong)uVar15 * 4;
    local_288 = in_RDX + (ulong)uVar15 * 4;
  }
  else {
    for (; 0x3f < (int)local_26c; local_26c = local_26c - 0x40) {
      uVar1 = local_280[1];
      uVar2 = local_280[2];
      uVar3 = local_280[3];
      uVar4 = local_280[4];
      uVar5 = local_280[5];
      uVar6 = local_280[6];
      uVar7 = local_280[7];
      uVar8 = local_288[1];
      uVar9 = local_288[2];
      uVar10 = local_288[3];
      uVar11 = local_288[4];
      uVar12 = local_288[5];
      uVar13 = local_288[6];
      uVar14 = local_288[7];
      *local_278 = *local_280 ^ *local_288;
      local_278[1] = uVar1 ^ uVar8;
      local_278[2] = uVar2 ^ uVar9;
      local_278[3] = uVar3 ^ uVar10;
      local_278[4] = uVar4 ^ uVar11;
      local_278[5] = uVar5 ^ uVar12;
      local_278[6] = uVar6 ^ uVar13;
      local_278[7] = uVar7 ^ uVar14;
      local_280 = local_280 + 8;
      local_288 = local_288 + 8;
      local_278 = local_278 + 8;
    }
  }
  for (; 0xf < (int)local_26c; local_26c = local_26c - 0x10) {
    uVar1 = local_280[1];
    uVar2 = local_288[1];
    *local_278 = *local_280 ^ *local_288;
    local_278[1] = uVar1 ^ uVar2;
    local_280 = local_280 + 2;
    local_288 = local_288 + 2;
    local_278 = local_278 + 2;
  }
  uVar15 = local_26c & 8;
  if (uVar15 != 0) {
    *local_278 = *local_280 ^ *local_288;
  }
  if ((local_26c & 4) != 0) {
    *(uint *)((long)local_278 + (long)(int)uVar15) =
         *(uint *)((long)local_280 + (long)(int)uVar15) ^
         *(uint *)((long)local_288 + (long)(int)uVar15);
  }
  iVar16 = uVar15 + (local_26c & 4);
  local_26c = local_26c & 3;
  if (local_26c != 1) {
    if (local_26c != 2) {
      if (local_26c != 3) {
        return;
      }
      *(byte *)((long)local_278 + (long)(iVar16 + 2)) =
           *(byte *)((long)local_280 + (long)(iVar16 + 2)) ^
           *(byte *)((long)local_288 + (long)(iVar16 + 2));
    }
    *(byte *)((long)local_278 + (long)(iVar16 + 1)) =
         *(byte *)((long)local_280 + (long)(iVar16 + 1)) ^
         *(byte *)((long)local_288 + (long)(iVar16 + 1));
  }
  *(byte *)((long)local_278 + (long)iVar16) =
       *(byte *)((long)local_280 + (long)iVar16) ^ *(byte *)((long)local_288 + (long)iVar16);
  return;
}

Assistant:

void gf256_addset_mem(void * GF256_RESTRICT vz, const void * GF256_RESTRICT vx,
                                 const void * GF256_RESTRICT vy, int bytes)
{
    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128*>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128*>(vx);
    const GF256_M128 * GF256_RESTRICT y16 = reinterpret_cast<const GF256_M128*>(vy);

#if defined(GF256_TARGET_MOBILE)
# if defined(GF256_TRY_NEON)
    // Handle multiples of 64 bytes
    if (CpuHasNeon)
    {
        while (bytes >= 64)
        {
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 x1 = vld1q_u8((uint8_t*)(x16 + 1));
            GF256_M128 x2 = vld1q_u8((uint8_t*)(x16 + 2));
            GF256_M128 x3 = vld1q_u8((uint8_t*)(x16 + 3));
            GF256_M128 y0 = vld1q_u8((uint8_t*)(y16));
            GF256_M128 y1 = vld1q_u8((uint8_t*)(y16 + 1));
            GF256_M128 y2 = vld1q_u8((uint8_t*)(y16 + 2));
            GF256_M128 y3 = vld1q_u8((uint8_t*)(y16 + 3));

            vst1q_u8((uint8_t*)z16,     veorq_u8(x0, y0));
            vst1q_u8((uint8_t*)(z16 + 1), veorq_u8(x1, y1));
            vst1q_u8((uint8_t*)(z16 + 2), veorq_u8(x2, y2));
            vst1q_u8((uint8_t*)(z16 + 3), veorq_u8(x3, y3));

            bytes -= 64, x16 += 4, y16 += 4, z16 += 4;
        }

        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            // z[i] = x[i] xor y[i]
            vst1q_u8((uint8_t*)z16,
                     veorq_u8(
                         vld1q_u8((uint8_t*)x16),
                         vld1q_u8((uint8_t*)y16)));

            bytes -= 16, ++x16, ++y16, ++z16;
        }
    }
    else
# endif // GF256_TRY_NEON
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z16);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x16);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y16);

        const unsigned count = (unsigned)bytes / 8;
        for (unsigned ii = 0; ii < count; ++ii)
            z8[ii] = x8[ii] ^ y8[ii];

        x16 = reinterpret_cast<const GF256_M128 *>(x8 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y8 + count);
        z16 = reinterpret_cast<GF256_M128 *>(z8 + count);

        bytes -= (count * 8);
    }
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (CpuHasAVX2)
    {
        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(z16);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(x16);
        const GF256_M256 * GF256_RESTRICT y32 = reinterpret_cast<const GF256_M256 *>(y16);

        const unsigned count = bytes / 32;
        for (unsigned i = 0; i < count; ++i)
        {
            _mm256_storeu_si256(z32 + i,
                _mm256_xor_si256(
                    _mm256_loadu_si256(x32 + i),
                    _mm256_loadu_si256(y32 + i)));
        }

        bytes -= count * 32;
        z16 = reinterpret_cast<GF256_M128 *>(z32 + count);
        x16 = reinterpret_cast<const GF256_M128 *>(x32 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y32 + count);
    }
    else
# endif // GF256_TRY_AVX2
    {
        // Handle multiples of 64 bytes
        while (bytes >= 64)
        {
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 x1 = _mm_loadu_si128(x16 + 1);
            GF256_M128 x2 = _mm_loadu_si128(x16 + 2);
            GF256_M128 x3 = _mm_loadu_si128(x16 + 3);
            GF256_M128 y0 = _mm_loadu_si128(y16);
            GF256_M128 y1 = _mm_loadu_si128(y16 + 1);
            GF256_M128 y2 = _mm_loadu_si128(y16 + 2);
            GF256_M128 y3 = _mm_loadu_si128(y16 + 3);

            _mm_storeu_si128(z16,     _mm_xor_si128(x0, y0));
            _mm_storeu_si128(z16 + 1, _mm_xor_si128(x1, y1));
            _mm_storeu_si128(z16 + 2, _mm_xor_si128(x2, y2));
            _mm_storeu_si128(z16 + 3, _mm_xor_si128(x3, y3));

            bytes -= 64, x16 += 4, y16 += 4, z16 += 4;
        }
    }

    // Handle multiples of 16 bytes
    while (bytes >= 16)
    {
        // z[i] = x[i] xor y[i]
        _mm_storeu_si128(z16,
            _mm_xor_si128(
                _mm_loadu_si128(x16),
                _mm_loadu_si128(y16)));

        bytes -= 16, ++x16, ++y16, ++z16;
    }
#endif // GF256_TARGET_MOBILE

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t *>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t *>(x16);
    const uint8_t * GF256_RESTRICT y1 = reinterpret_cast<const uint8_t *>(y16);

    // Handle a block of 8 bytes
    const int eight = bytes & 8;
    if (eight)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x1);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y1);
        *z8 = *x8 ^ *y8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1 + eight);
        const uint32_t * GF256_RESTRICT x4 = reinterpret_cast<const uint32_t *>(x1 + eight);
        const uint32_t * GF256_RESTRICT y4 = reinterpret_cast<const uint32_t *>(y1 + eight);
        *z4 = *x4 ^ *y4;
    }

    // Handle final bytes
    const int offset = eight + four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] = x1[offset + 2] ^ y1[offset + 2];
    case 2: z1[offset + 1] = x1[offset + 1] ^ y1[offset + 1];
    case 1: z1[offset] = x1[offset] ^ y1[offset];
    default:
        break;
    }
}